

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_palette.c
# Opt level: O1

bool_t prf_color_palette_load_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  pool_t pool_id;
  uint16_t uVar1;
  uint32_t uVar2;
  uint8_t *puVar3;
  uint uVar4;
  bool_t bVar5;
  uint uVar6;
  long lVar7;
  ushort *puVar8;
  
  uVar1 = bf_get_uint16_be(bfile);
  node->opcode = uVar1;
  if (uVar1 == prf_color_palette_info.opcode) {
    uVar1 = bf_get_uint16_be(bfile);
    node->length = uVar1;
    if (node->data == (uint8_t *)0x0) {
      pool_id = state->model->mempool_id;
      if (pool_id == 0) {
        puVar3 = (uint8_t *)malloc((ulong)uVar1 - 4);
      }
      else {
        puVar3 = (uint8_t *)pool_malloc(pool_id,uVar1 - 4);
      }
      node->data = puVar3;
      if (puVar3 == (uint8_t *)0x0) {
        prf_error(6,"malloc returned NULL");
        uVar6 = 4;
        goto LAB_0010799c;
      }
    }
    uVar6 = 4;
    if (0x83 < node->length) {
      puVar3 = node->data;
      bf_read(bfile,puVar3,0x80);
      lVar7 = 0;
      do {
        if ((uint)node->length < (int)lVar7 + 0x88U) {
          uVar6 = (int)lVar7 + 0x84;
          goto LAB_00107a26;
        }
        uVar2 = bf_get_uint32_be(bfile);
        *(uint32_t *)(puVar3 + lVar7 + 0x80) = uVar2;
        lVar7 = lVar7 + 4;
      } while (lVar7 != 0x1000);
      uVar6 = 0x1084;
LAB_00107a26:
      uVar4 = uVar6 + 4;
      if (uVar4 <= node->length) {
        uVar2 = bf_get_uint32_be(bfile);
        *(uint32_t *)(puVar3 + 0x1080) = uVar2;
        uVar6 = uVar4;
        if (uVar2 != 0) {
          puVar8 = (ushort *)(node->data + 0x1084);
          uVar4 = 0;
          do {
            uVar1 = bf_get_uint16_be(bfile);
            *puVar8 = uVar1;
            uVar1 = bf_get_uint16_be(bfile);
            puVar8[1] = uVar1;
            uVar1 = bf_get_uint16_be(bfile);
            puVar8[2] = uVar1;
            uVar1 = bf_get_uint16_be(bfile);
            puVar8[3] = uVar1;
            bf_read(bfile,(uint8_t *)(puVar8 + 4),*puVar8 - 8);
            uVar6 = uVar6 + *puVar8;
            puVar8 = (ushort *)((long)puVar8 + (ulong)*puVar8);
            uVar4 = uVar4 + 1;
          } while (uVar4 < *(uint *)(puVar3 + 0x1080));
        }
      }
    }
    bVar5 = 1;
    uVar4 = node->length - uVar6;
    if (uVar4 != 0 && (int)uVar6 <= (int)(uint)node->length) {
      bf_read(bfile,node->data + (long)(int)uVar6 + -4,uVar4);
    }
  }
  else {
    prf_error(9,"tried color palette loader for other node type");
    uVar6 = 2;
LAB_0010799c:
    bVar5 = 0;
    bf_rewind(bfile,uVar6);
  }
  return bVar5;
}

Assistant:

static
bool_t
prf_color_palette_load_f(
    prf_node_t * node,
    prf_state_t * state,
    bfile_t * bfile )
{
    int pos;

    assert( node != NULL && state != NULL && bfile != NULL );

    node->opcode = bf_get_uint16_be( bfile );
    if ( node->opcode != prf_color_palette_info.opcode ) {
        prf_error( 9, "tried color palette loader for other node type" );
        bf_rewind( bfile, 2 );
        return FALSE;
    }

    node->length = bf_get_uint16_be( bfile );

    if ( node->data == NULL ) { /* not pre-allocated */
        assert( state->model != NULL );
        if ( state->model->mempool_id == 0 )
            node->data = (uint8_t *)malloc( node->length - 4 + NODE_DATA_PAD );
        else
            node->data = (uint8_t *)pool_malloc( state->model->mempool_id,
                node->length - 4 + NODE_DATA_PAD );
        if ( node->data == NULL ) {
            prf_error( 6, "malloc returned NULL" );
            bf_rewind( bfile, 4 );
            return FALSE;
        }
    }

    pos = 4;
    do {
        unsigned int i;
        uint8_t * ptr;
        node_data * data;
        data = (node_data *) node->data;
        if ( node->length < (pos + 128) ) break;
        bf_read( bfile, (uint8_t *) data->reserved1, 128 ); pos += 128;
        for ( i = 0; i < 1024 && (pos + 4) <= node->length; i++ ) {
            data->brightest_rgb[i] = bf_get_uint32_be( bfile ); pos += 4;
#if 0
	    fprintf(stderr, "palette load (%d): 0x%x\n",
		    i, data->brightest_rgb[i]);
#endif
        }

        if ( node->length < (pos + 4) ) break;
        data->num_color_names = bf_get_uint32_be( bfile ); pos += 4;
        ptr = node->data + sizeof( node_data );

        i = 0;
        while ( i < data->num_color_names ) {
            struct prf_color_name_data * cdata;
            cdata = (struct prf_color_name_data *) ptr;
            cdata->length = bf_get_uint16_be( bfile );
            cdata->reserved1 = bf_get_uint16_be( bfile );
            cdata->index = bf_get_uint16_be( bfile );
            cdata->reserved2 = bf_get_uint16_be( bfile );
            bf_read( bfile, (uint8_t *) cdata->name, cdata->length - 8 );
            pos += cdata->length;
            ptr += cdata->length;
            i++;
        }
    } while ( FALSE );

    if ( pos < node->length )
        pos += bf_read( bfile, node->data + pos - 4 + NODE_DATA_PAD,
            node->length - pos );

    return TRUE;
}